

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O1

void svc_xprt_clear(SVCXPRT *xprt)

{
  ulong uVar1;
  rbtree_x_part *prVar2;
  rbtree_x_part *prVar3;
  int iVar4;
  
  if ((initialized == '\0') && (iVar4 = svc_xprt_init(), iVar4 != 0)) {
    return;
  }
  prVar3 = svc_xprt_fd.xt.tree;
  if (*(int *)((long)&xprt[1].xp_lock + 0x24) == 0) {
    return;
  }
  uVar1 = (ulong)(uint)xprt->xp_fd % (ulong)svc_xprt_fd.xt.npart;
  LOCK();
  svc_xprt_fd.connections = svc_xprt_fd.connections - 1;
  UNLOCK();
  prVar2 = svc_xprt_fd.xt.tree + uVar1;
  iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)&prVar2->lock);
  if (iVar4 == 0) {
    opr_rbtree_remove(&prVar3[uVar1].t,(opr_rbtree_node *)((long)&xprt[1].xp_lock + 8));
    iVar4 = pthread_rwlock_unlock((pthread_rwlock_t *)&prVar2->lock);
    if (iVar4 == 0) {
      return;
    }
  }
  abort();
}

Assistant:

void
svc_xprt_clear(SVCXPRT *xprt)
{
	struct rbtree_x_part *t;

	if (svc_xprt_init_failure())
		return;

	/* xprt lock ensures only one active thread here */
	if (opr_rbtree_node_valid(&REC_XPRT(xprt)->fd_node)) {
		t = rbtx_partition_of_scalar(&svc_xprt_fd.xt, xprt->xp_fd);

		/* if another thread passes test during svc_xprt_shutdown(),
		 * this lock (and generation test) prevents repeats.
		 */
		atomic_dec_uint32_t(&svc_xprt_fd.connections);
		rwlock_wrlock(&t->lock);
		opr_rbtree_remove(&t->t, &REC_XPRT(xprt)->fd_node);
		rwlock_unlock(&t->lock);
	}
}